

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O2

void stmm_free_table(stmm_table *table)

{
  if ((Extra_MmFixed_t *)table->pMemMan != (Extra_MmFixed_t *)0x0) {
    Extra_MmFixedStop((Extra_MmFixed_t *)table->pMemMan);
  }
  free(table->bins);
  free(table);
  return;
}

Assistant:

void
stmm_free_table (stmm_table *table)
{
/*
    stmm_table_entry *ptr, *next;
    int i;
    for ( i = 0; i < table->num_bins; i++ )
    {
        ptr = table->bins[i];
        while ( ptr != NULL )
        {
            next = ptr->next;
            ABC_FREE( ptr );
            ptr = next;
        }
    }
*/
    // no need to deallocate entries because they are in the memory manager now
    // added by alanmi
    if ( table->pMemMan )
        Extra_MmFixedStop ((Extra_MmFixed_t *)table->pMemMan);
    ABC_FREE(table->bins);
    ABC_FREE(table);
}